

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

bool __thiscall Minisat::Solver::reduceDB_Core(Solver *this)

{
  vec<unsigned_int> *v;
  anon_struct_8_10_eb538618_for_header *c;
  uint uVar1;
  uint *puVar2;
  anon_struct_8_10_eb538618_for_header aVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  uint *puVar8;
  long lVar9;
  long lVar10;
  int local_48;
  
  if (0 < this->verbosity) {
    printf("c Core size before reduce: %i\n",(ulong)(uint)(this->learnts_core).sz);
  }
  v = &this->learnts_core;
  sort<unsigned_int,reduceDB_c>(v,(reduceDB_c)&this->ca);
  iVar5 = (this->learnts_core).sz;
  local_48 = iVar5 / 2;
  lVar10 = 0;
  lVar9 = 0;
  iVar7 = 0;
  do {
    if (iVar5 <= lVar9) {
      vec<unsigned_int>::shrink(v,(int)lVar9 - iVar7);
      if (0 < this->verbosity) {
        printf("c Core size after reduce: %i, dropped more than 5 percent: %d\n",
               (ulong)(uint)(this->learnts_core).sz,(ulong)((double)iVar7 < (double)iVar5 * 0.95));
      }
      return (double)iVar7 < (double)iVar5 * 0.95;
    }
    puVar8 = v->data;
    puVar2 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
    uVar1 = puVar2[*(uint *)((long)puVar8 + lVar10)];
    if ((~uVar1 & 3) == 0) {
      c = (anon_struct_8_10_eb538618_for_header *)(puVar2 + *(uint *)((long)puVar8 + lVar10));
      if (0x40 < (uVar1 & 0x3fffffe0)) {
        bVar4 = locked(this,(Clause *)c);
        if (bVar4) {
          puVar8 = v->data;
        }
        else {
          puVar8 = (this->learnts_core).data;
          if (((ulong)(*(int *)(&c[1].field_0x4 + ((ulong)*c >> 0x22) * 4) + 100000) <
               this->conflicts) && (lVar9 < local_48)) {
            vec<unsigned_int>::push(&this->learnts_tier2,(uint *)((long)puVar8 + lVar10));
            aVar3 = *c;
            *c = (anon_struct_8_10_eb538618_for_header)((ulong)aVar3 & 0xfffffffffffffffc | 2);
            *(int *)(&c[1].field_0x4 + ((ulong)aVar3 >> 0x22) * 4) = (int)this->conflicts;
            goto LAB_00118610;
          }
        }
      }
      lVar6 = (long)iVar7;
      iVar7 = iVar7 + 1;
      puVar8[lVar6] = *(uint *)((long)puVar8 + lVar10);
      bVar4 = locked(this,(Clause *)c);
      if (((bVar4) || ((SUB84(*c,0) & 0x3fffffe0) < 0x60)) ||
         ((ulong)(*(int *)(&c[1].field_0x4 + ((ulong)*c >> 0x22) * 4) + 50000) < this->conflicts)) {
        local_48 = local_48 + 1;
      }
    }
LAB_00118610:
    lVar9 = lVar9 + 1;
    iVar5 = (this->learnts_core).sz;
    lVar10 = lVar10 + 4;
  } while( true );
}

Assistant:

bool Solver::reduceDB_Core()
{
    if (verbosity > 0) printf("c Core size before reduce: %i\n", learnts_core.size());
    int i, j;
    bool ret = false;
    sort(learnts_core, reduceDB_c(ca));
    int limit = learnts_core.size() / 2;

    for (i = j = 0; i < learnts_core.size(); i++) {
        Clause &c = ca[learnts_core[i]];
        if (c.mark() == CORE) {
            if (c.lbd() > 2 && !locked(c) && (c.touched() + 100000 < conflicts) && i < limit) {
                learnts_tier2.push(learnts_core[i]);
                c.mark(TIER2);
                // c.removable(true);
                // c.activity() = 0;
                c.touched() = conflicts;
                // claBumpActivity(c);
            } else {
                learnts_core[j++] = learnts_core[i];
                if (locked(c) || (c.touched() + 50000 < conflicts) || c.lbd() <= 2) {
                    limit++;
                }
            }
        }
    }
    ret = j < learnts_core.size() * 0.95;
    learnts_core.shrink(i - j);
    if (verbosity > 0)
        printf("c Core size after reduce: %i, dropped more than 5 percent: %d\n", learnts_core.size(), ret);

    return ret;
}